

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_IntSortCostReverse(Gia_Man_t *pNew,int *pArray,int nSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar1 = 1;
  if (1 < nSize) {
    iVar1 = nSize;
  }
  uVar7 = 1;
  for (uVar5 = 0; uVar5 != iVar1 - 1; uVar5 = uVar5 + 1) {
    uVar9 = uVar5 & 0xffffffff;
    uVar6 = uVar7;
    while( true ) {
      uVar8 = (uint)uVar9;
      if ((uint)nSize == uVar6) break;
      iVar2 = Abc_Lit2Var(pArray[uVar6]);
      iVar2 = Gia_ObjLevelId(pNew,iVar2);
      iVar3 = Abc_Lit2Var(pArray[(int)uVar8]);
      iVar3 = Gia_ObjLevelId(pNew,iVar3);
      uVar4 = (uint)uVar6;
      if (iVar2 <= iVar3) {
        uVar4 = uVar8;
      }
      uVar6 = uVar6 + 1;
      uVar9 = (ulong)uVar4;
    }
    iVar2 = pArray[uVar5];
    pArray[uVar5] = pArray[(int)uVar8];
    pArray[(int)uVar8] = iVar2;
    uVar7 = uVar7 + 1;
  }
  return;
}

Assistant:

void Wlc_IntSortCostReverse( Gia_Man_t * pNew, int * pArray, int nSize )
{
    int i, j, best_i;
    for ( i = 0; i < nSize-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < nSize; j++ )
            if ( Gia_ObjLevelId(pNew, Abc_Lit2Var(pArray[j])) > Gia_ObjLevelId(pNew, Abc_Lit2Var(pArray[best_i])) )
                best_i = j;
        ABC_SWAP( int, pArray[i], pArray[best_i] );
    }
}